

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexer.cpp
# Opt level: O0

void __thiscall
Indexer::Indexer(Indexer *this,DatabaseSnapshot *snap,
                vector<IndexType,_std::allocator<IndexType>_> *types)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  vector<IndexType,_std::allocator<IndexType>_> *this_00;
  vector<IndexType,_std::allocator<IndexType>_> *in_stack_ffffffffffffffc0;
  BuilderType in_stack_ffffffffffffffcc;
  DatasetBuilder *in_stack_ffffffffffffffd0;
  vector<IndexType,_std::allocator<IndexType>_> *in_stack_ffffffffffffffd8;
  vector<IndexType,_std::allocator<IndexType>_> *in_stack_ffffffffffffffe0;
  
  *in_RDI = in_RSI;
  std::vector<IndexType,_std::allocator<IndexType>_>::vector
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  this_00 = (vector<IndexType,_std::allocator<IndexType>_> *)(in_RDI + 4);
  std::vector<IndexType,_std::allocator<IndexType>_>::vector
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  DatasetBuilder::DatasetBuilder
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
  std::vector<IndexType,_std::allocator<IndexType>_>::~vector(this_00);
  std::vector<IndexType,_std::allocator<IndexType>_>::vector
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  DatasetBuilder::DatasetBuilder
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
  std::vector<IndexType,_std::allocator<IndexType>_>::~vector(this_00);
  std::
  vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  ::vector((vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
            *)0x194305);
  return;
}

Assistant:

Indexer::Indexer(const DatabaseSnapshot *snap,
                 const std::vector<IndexType> &types)
    : snap(snap),
      types(types),
      flat_builder(BuilderType::FLAT, types),
      bitmap_builder(BuilderType::BITMAP, types) {}